

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nwkTiming.c
# Opt level: O1

void Nwk_NodeUpdateAddToQueue(Vec_Ptr_t *vQueue,Nwk_Obj_t *pObj,int iCurrent,int fArrival)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  void *pvVar5;
  void **ppvVar6;
  long lVar7;
  long lVar8;
  int iVar9;
  int iVar10;
  
  uVar1 = vQueue->nCap;
  if (vQueue->nSize == uVar1) {
    if ((int)uVar1 < 0x10) {
      if (vQueue->pArray == (void **)0x0) {
        ppvVar6 = (void **)malloc(0x80);
      }
      else {
        ppvVar6 = (void **)realloc(vQueue->pArray,0x80);
      }
      vQueue->pArray = ppvVar6;
      iVar10 = 0x10;
    }
    else {
      iVar10 = uVar1 * 2;
      if (iVar10 <= (int)uVar1) goto LAB_0049a649;
      if (vQueue->pArray == (void **)0x0) {
        ppvVar6 = (void **)malloc((ulong)uVar1 << 4);
      }
      else {
        ppvVar6 = (void **)realloc(vQueue->pArray,(ulong)uVar1 << 4);
      }
      vQueue->pArray = ppvVar6;
    }
    vQueue->nCap = iVar10;
  }
LAB_0049a649:
  iVar2 = vQueue->nSize;
  lVar7 = (long)iVar2;
  iVar9 = iVar2 + 1;
  vQueue->nSize = iVar9;
  vQueue->pArray[lVar7] = pObj;
  iVar10 = iCurrent + 1;
  lVar8 = (long)iVar10;
  if (iVar10 < iVar2) {
    do {
      ppvVar6 = vQueue->pArray;
      pvVar5 = ppvVar6[(long)iVar9 + -2];
      iVar3 = *(int *)((long)pvVar5 + 0x2c);
      iVar4 = *(int *)((long)ppvVar6[lVar7] + 0x2c);
      if (fArrival == 0) {
        if (iVar4 <= iVar3) break;
      }
      else if (iVar3 <= iVar4) break;
      ppvVar6[(long)iVar9 + -2] = ppvVar6[lVar7];
      vQueue->pArray[lVar7] = pvVar5;
      lVar7 = lVar7 + -1;
      iVar9 = iVar9 + -1;
    } while (lVar8 < lVar7);
  }
  if (iVar10 < iVar2) {
    lVar7 = 1;
    do {
      iVar10 = *(int *)((long)vQueue->pArray[lVar8 + lVar7 + -1] + 0x2c);
      iVar9 = *(int *)((long)vQueue->pArray[lVar8 + lVar7] + 0x2c);
      if (fArrival == 0) {
        if (iVar10 < iVar9) {
          __assert_fail("Nwk_ObjLevel(pTemp1) >= Nwk_ObjLevel(pTemp2)",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/nwk/nwkTiming.c"
                        ,0x223,"void Nwk_NodeUpdateAddToQueue(Vec_Ptr_t *, Nwk_Obj_t *, int, int)");
        }
      }
      else if (iVar9 < iVar10) {
        __assert_fail("Nwk_ObjLevel(pTemp1) <= Nwk_ObjLevel(pTemp2)",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/nwk/nwkTiming.c"
                      ,0x221,"void Nwk_NodeUpdateAddToQueue(Vec_Ptr_t *, Nwk_Obj_t *, int, int)");
      }
      lVar7 = lVar7 + 1;
    } while (iVar2 - iCurrent != (int)lVar7);
  }
  return;
}

Assistant:

void Nwk_NodeUpdateAddToQueue( Vec_Ptr_t * vQueue, Nwk_Obj_t * pObj, int iCurrent, int fArrival )
{
    Nwk_Obj_t * pTemp1, * pTemp2;
    int i;
    Vec_PtrPush( vQueue, pObj );
    for ( i = Vec_PtrSize(vQueue) - 1; i > iCurrent + 1; i-- )
    {
        pTemp1 = (Nwk_Obj_t *)vQueue->pArray[i];
        pTemp2 = (Nwk_Obj_t *)vQueue->pArray[i-1];
        if ( fArrival )
        {
            if ( Nwk_ObjLevel(pTemp2) <= Nwk_ObjLevel(pTemp1) )
                break;
        }
        else
        {
            if ( Nwk_ObjLevel(pTemp2) >= Nwk_ObjLevel(pTemp1) )
                break;
        }
        vQueue->pArray[i-1] = pTemp1;
        vQueue->pArray[i]   = pTemp2;
    }
    // verification
    for ( i = iCurrent + 1; i < Vec_PtrSize(vQueue) - 1; i++ )
    {
        pTemp1 = (Nwk_Obj_t *)vQueue->pArray[i];
        pTemp2 = (Nwk_Obj_t *)vQueue->pArray[i+1];
        if ( fArrival )
            assert( Nwk_ObjLevel(pTemp1) <= Nwk_ObjLevel(pTemp2) );
        else
            assert( Nwk_ObjLevel(pTemp1) >= Nwk_ObjLevel(pTemp2) );
    }
}